

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_tail_multiple.h
# Opt level: O0

ControlBlock * __thiscall
density::detail::
SpQueue_TailMultiple<density::runtime_type<>,_density_tests::move_only_void_allocator,_density::default_busy_wait>
::create_page(SpQueue_TailMultiple<density::runtime_type<>,_density_tests::move_only_void_allocator,_density::default_busy_wait>
              *this,LfQueue_ProgressGuarantee i_progress_guarantee)

{
  progress_guarantee i_progress_guarantee_00;
  ControlBlock *i_atomic;
  undefined8 local_38;
  ControlBlock *new_page_end_block;
  ControlBlock *new_page;
  LfQueue_ProgressGuarantee i_progress_guarantee_local;
  SpQueue_TailMultiple<density::runtime_type<>,_density_tests::move_only_void_allocator,_density::default_busy_wait>
  *this_local;
  
  if (i_progress_guarantee == LfQueue_Throwing) {
    local_38 = (ControlBlock *)
               basic_default_allocator<65536UL>::allocate_page
                         ((basic_default_allocator<65536UL> *)this);
  }
  else {
    i_progress_guarantee_00 = ToDenGuarantee(i_progress_guarantee);
    local_38 = (ControlBlock *)
               basic_default_allocator<65536UL>::try_allocate_page
                         ((basic_default_allocator<65536UL> *)this,i_progress_guarantee_00);
  }
  if (local_38 != (ControlBlock *)0x0) {
    i_atomic = LFQueue_Base<density::runtime_type<>,_density_tests::move_only_void_allocator,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density_tests::move_only_void_allocator,_density::default_busy_wait>_>
               ::get_end_control_block(local_38);
    raw_atomic_store(&i_atomic->m_next,8,memory_order_seq_cst);
    raw_atomic_store(&local_38->m_next,0,memory_order_seq_cst);
  }
  return local_38;
}

Assistant:

ControlBlock * create_page(LfQueue_ProgressGuarantee i_progress_guarantee)
            {
                auto const new_page = static_cast<ControlBlock *>(
                  i_progress_guarantee == LfQueue_Throwing
                    ? ALLOCATOR_TYPE::allocate_page()
                    : ALLOCATOR_TYPE::try_allocate_page(ToDenGuarantee(i_progress_guarantee)));
                if (new_page)
                {
                    auto const new_page_end_block = get_end_control_block(new_page);
                    raw_atomic_store(
                      &new_page_end_block->m_next, uintptr_t(LfQueue_InvalidNextPage));

                    raw_atomic_store(&new_page->m_next, uintptr_t(0), mem_release);
                }
                return new_page;
            }